

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O3

bool __thiscall calculator::ExpressionParser<__int128>::isHex(ExpressionParser<__int128> *this)

{
  ulong uVar1;
  char cVar2;
  pointer pcVar3;
  int iVar4;
  uint uVar5;
  
  uVar1 = this->index_ + 2;
  if (uVar1 < (this->expr_)._M_string_length) {
    pcVar3 = (this->expr_)._M_dataplus._M_p;
    iVar4 = tolower((int)pcVar3[this->index_ + 1]);
    if (iVar4 == 0x78) {
      cVar2 = pcVar3[uVar1];
      iVar4 = (int)cVar2;
      if ((byte)(cVar2 - 0x30U) < 10) {
        uVar5 = iVar4 - 0x30;
      }
      else if ((byte)(cVar2 + 0x9fU) < 6) {
        uVar5 = iVar4 - 0x57;
      }
      else {
        uVar5 = 0x10;
        if ((byte)(cVar2 + 0xbfU) < 6) {
          uVar5 = iVar4 - 0x37;
        }
      }
      return uVar5 < 0x10;
    }
  }
  return false;
}

Assistant:

bool isHex() const
  {
    if (index_ + 2 < expr_.size())
    {
      char x = expr_[index_ + 1];
      char h = expr_[index_ + 2];
      return (std::tolower(x) == 'x' && toInteger(h) <= 0xf);
    }
    return false;
  }